

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

int memory_not_equal_display_error(char *a,char *b,size_t size)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = 0;
  for (sVar1 = 0; size != sVar1; sVar1 = sVar1 + 1) {
    sVar2 = sVar2 + (a[sVar1] == b[sVar1]);
  }
  if (sVar2 == size) {
    cm_print_error("%zdbytes of %p and %p the same\n",size,a);
  }
  return (uint)(sVar2 != size);
}

Assistant:

static int memory_not_equal_display_error(
        const char* const a, const char* const b, const size_t size) {
    size_t same = 0;
    size_t i;
    for (i = 0; i < size; i++) {
        const char l = a[i];
        const char r = b[i];
        if (l == r) {
            same ++;
        }
    }
    if (same == size) {
        cm_print_error("%"PRIdS "bytes of %p and %p the same\n",
                       same, (void *)a, (void *)b);
        return 0;
    }
    return 1;
}